

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O2

void act_var_bump(sat_solver3 *s,int v)

{
  int iVar1;
  xdbl xVar2;
  word wVar3;
  double dVar4;
  
  iVar1 = s->VarActType;
  if (iVar1 == 2) {
    xVar2 = Xdbl_Add(s->activity[v],s->var_inc);
    s->activity[v] = xVar2;
    if (xVar2 < 0x14c924d692ca61c) goto LAB_007287df;
  }
  else if (iVar1 == 1) {
    dVar4 = (double)s->activity[v] + (double)s->var_inc;
    s->activity[v] = (word)dVar4;
    if (dVar4 <= 1e+100) goto LAB_007287df;
  }
  else {
    if (iVar1 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver3.c"
                    ,0x146,"void act_var_bump(sat_solver3 *, int)");
    }
    wVar3 = s->activity[v] + s->var_inc;
    s->activity[v] = wVar3;
    if (-1 < (int)wVar3) goto LAB_007287df;
  }
  act_var_rescale(s);
LAB_007287df:
  if (s->orderpos[v] == -1) {
    return;
  }
  order_update(s,v);
  return;
}

Assistant:

static inline void act_var_bump(sat_solver3* s, int v) 
{
    if ( s->VarActType == 0 )
    {
        s->activity[v] += s->var_inc;
        if ((unsigned)s->activity[v] & 0x80000000)
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else if ( s->VarActType == 1 )
    {
        double act = Abc_Word2Dbl(s->activity[v]) + Abc_Word2Dbl(s->var_inc);
        s->activity[v] = Abc_Dbl2Word(act);
        if (act > 1e100)
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else if ( s->VarActType == 2 )
    {
        s->activity[v] = Xdbl_Add( s->activity[v], s->var_inc );
        if (s->activity[v] > ABC_CONST(0x014c924d692ca61b))
            act_var_rescale(s);
        if (s->orderpos[v] != -1)
            order_update(s,v);
    }
    else assert(0);
}